

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  Decoration DVar1;
  pointer pDVar2;
  mapped_type *pmVar3;
  pointer pDVar4;
  bool bVar5;
  Id local_c;
  
  local_c = id;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->idToQCOMDecorations,&local_c);
  pDVar4 = (pmVar3->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar2 = (pmVar3->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = pDVar4 != pDVar2;
  if (bVar5) {
    DVar1 = *pDVar4;
    while (DVar1 != decor) {
      pDVar4 = pDVar4 + 1;
      bVar5 = pDVar4 != pDVar2;
      if (pDVar4 == pDVar2) {
        return bVar5;
      }
      DVar1 = *pDVar4;
    }
  }
  return bVar5;
}

Assistant:

bool TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration(spv::Id id, spv::Decoration decor)
{
  std::vector<spv::Decoration> &decoVec = idToQCOMDecorations[id];
  for ( auto d : decoVec ) {
    if ( d == decor )
      return true;
  }
  return false;
}